

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

bool __thiscall
ON_RenderContentPrivate::SetChild
          (ON_RenderContentPrivate *this,ON_RenderContent *child,wchar_t *child_slot_name)

{
  ON_RenderContentPrivate *this_00;
  bool bVar1;
  ON_RenderContent *pOVar2;
  ON_XMLVariant OStack_128;
  
  std::recursive_mutex::lock(&this->m_mutex);
  if (child != (ON_RenderContent *)0x0) {
    this_00 = child->_private;
    if (this_00->m_model == (ONX_Model *)0x0) {
      bVar1 = false;
      if ((child_slot_name == (wchar_t *)0x0) || (this_00->m_parent != (ON_RenderContent *)0x0))
      goto LAB_005a48ef;
      if (*child_slot_name != L'\0') {
        ::ON_XMLVariant::ON_XMLVariant(&OStack_128,child_slot_name);
        SetPropertyValue(this_00,L"child-slot-name",&OStack_128);
        ::ON_XMLVariant::~ON_XMLVariant(&OStack_128);
        goto LAB_005a4888;
      }
    }
LAB_005a483c:
    bVar1 = false;
    goto LAB_005a48ef;
  }
LAB_005a4888:
  pOVar2 = FindChild(this,child_slot_name);
  if (pOVar2 == (ON_RenderContent *)0x0) {
    if (child != (ON_RenderContent *)0x0) {
      bVar1 = AddChild(this,child);
      if (!bVar1) goto LAB_005a483c;
      goto LAB_005a48ce;
    }
  }
  else {
    bVar1 = ChangeChild(this,pOVar2,child);
    if (child == (ON_RenderContent *)0x0 || !bVar1) goto LAB_005a48ef;
LAB_005a48ce:
    pOVar2 = TopLevel(this);
    child->_private->m_model = pOVar2->_private->m_model;
  }
  bVar1 = true;
LAB_005a48ef:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return bVar1;
}

Assistant:

bool ON_RenderContentPrivate::SetChild(ON_RenderContent* child, const wchar_t* child_slot_name)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  if (nullptr != child)
  {
    if (nullptr != child->_private->m_model)
      return false;

    if (nullptr != child->_private->m_parent)
      return false;

    if ((nullptr == child_slot_name) || (0 == child_slot_name[0]))
      return false;

    child->_private->SetPropertyValue(ON_RENDER_CONTENT_CHILD_SLOT_NAME, child_slot_name);
  }

  // Get any existing child with the same child slot name (may be null).
  auto* existing_child = FindChild(child_slot_name);
  if (nullptr != existing_child)
  {
    // There is an existing child with the same child slot name; replace it.
    if (!ChangeChild(existing_child, child)) // Deletes existing_child.
      return false;
  }
  else
  {
    // No existing child; just add the new one.
    if (nullptr != child)
    {
      if (!AddChild(*child))
        return false;
    }
  }

  if (nullptr != child)
  {
    auto* pModel = TopLevel()._private->m_model;
    child->_private->m_model = pModel;
  }

  return true;
}